

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.c
# Opt level: O2

sexp sexp_open_output_string_op(sexp ctx,sexp self,sexp_sint_t n)

{
  sexp psVar1;
  sexp psVar2;
  sexp_sint_t n_00;
  sexp_sint_t n_01;
  sexp res;
  sexp_gc_var_t local_20;
  
  local_20.var = &res;
  res = (sexp)&DAT_0000043e;
  local_20.next = (ctx->value).context.saves;
  (ctx->value).context.saves = &local_20;
  psVar1 = (sexp)0x0;
  res = sexp_make_output_port(ctx,(FILE *)0x0,(sexp)&DAT_0000003e);
  if ((((ulong)res & 3) != 0) || (psVar2 = res, res->tag != 0x13)) {
    psVar1 = sexp_cons_op(ctx,psVar1,n_00,(sexp)&DAT_0000003e,(sexp)&DAT_0000023e);
    (res->value).type.cpl = psVar1;
    psVar1 = sexp_make_bytes_op(ctx,(sexp)0x0,n_01,(sexp)&DAT_00002001,(sexp)&DAT_0000043e);
    (((res->value).type.cpl)->value).type.name = psVar1;
    psVar2 = (((res->value).type.cpl)->value).type.name;
    if ((((ulong)psVar2 & 3) != 0) || (psVar2->tag != 0x13)) {
      (res->value).type.setters = (sexp)((long)&psVar2->value + 8);
      (res->value).port.size = 0x1000;
      (res->value).type.print = (sexp)0x0;
      (res->value).flonum_bits[0x2a] = '\0';
      psVar2 = res;
    }
  }
  (ctx->value).context.saves = local_20.next;
  return psVar2;
}

Assistant:

sexp sexp_open_output_string_op (sexp ctx, sexp self, sexp_sint_t n) {
  sexp_gc_var1(res);
  sexp_gc_preserve1(ctx, res);
  res = sexp_make_output_port(ctx, NULL, SEXP_FALSE);
  if (!sexp_exceptionp(res)) {
    sexp_port_cookie(res) = sexp_cons(ctx, SEXP_FALSE, SEXP_NULL);
    sexp_car(sexp_port_cookie(res)) =
      sexp_make_bytes(ctx, sexp_make_fixnum(SEXP_PORT_BUFFER_SIZE), SEXP_VOID);
    if (sexp_exceptionp(sexp_car(sexp_port_cookie(res)))) {
      res = sexp_car(sexp_port_cookie(res));
    } else {
      sexp_port_buf(res) = sexp_bytes_data(sexp_car(sexp_port_cookie(res)));
      sexp_port_size(res) = SEXP_PORT_BUFFER_SIZE;
      sexp_port_offset(res) = 0;
      sexp_port_binaryp(res) = 0;
    }
  }
  sexp_gc_release1(ctx);
  return res;
}